

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcfour.c
# Opt level: O0

void arcfour_ssh2_setkey(ssh_cipher *cipher,void *key)

{
  ArcfourContext *ctx;
  void *key_local;
  ssh_cipher *cipher_local;
  
  arcfour_setkey((ArcfourContext *)(cipher + -0x21),(uchar *)key,cipher->vt->padded_keybytes);
  arcfour_stir((ArcfourContext *)(cipher + -0x21));
  return;
}

Assistant:

static void arcfour_ssh2_setkey(ssh_cipher *cipher, const void *key)
{
    ArcfourContext *ctx = container_of(cipher, ArcfourContext, ciph);
    arcfour_setkey(ctx, key, ctx->ciph.vt->padded_keybytes);
    arcfour_stir(ctx);
}